

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::refreshCharBuffer(XMLReader *this)

{
  XMLSize_t XVar1;
  XMLTranscoder *pXVar2;
  long lVar3;
  XMLSize_t XVar4;
  TranscodingException *this_00;
  XMLFilePos XVar5;
  long lVar6;
  ulong uVar7;
  XMLSize_t XVar8;
  uint uVar9;
  pointer_____offset_0x10___ *ppuVar10;
  long lVar11;
  bool bVar12;
  Codes failReason;
  Codes local_24;
  
  if (this->fNoMore == false) {
    XVar4 = this->fCharsAvail;
    XVar1 = this->fCharIndex;
    lVar11 = XVar4 - XVar1;
    bVar12 = true;
    if (lVar11 != 0x4000) {
      if (this->fTranscoder == (XMLTranscoder *)0x0) {
        if (this->fEncoding == EBCDIC) {
          this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    ((RuntimeException *)this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x22a,Reader_EncodingStrRequired,this->fMemoryManager);
          ppuVar10 = &RuntimeException::typeinfo;
LAB_002c4fde:
          __cxa_throw(this_00,ppuVar10,XMLException::~XMLException);
        }
        pXVar2 = XMLTransService::makeNewTranscoderFor
                           (XMLPlatformUtils::fgTransService,this->fEncodingStr,&local_24,0x4000,
                            this->fMemoryManager);
        this->fTranscoder = pXVar2;
        if (pXVar2 == (XMLTranscoder *)0x0) {
          this_00 = (TranscodingException *)__cxa_allocate_exception(0x30);
          TranscodingException::TranscodingException
                    (this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/XMLReader.cpp"
                     ,0x23e,Trans_CantCreateCvtrFor,this->fEncodingStr,(XMLCh *)0x0,(XMLCh *)0x0,
                     (XMLCh *)0x0,this->fMemoryManager);
          ppuVar10 = &TranscodingException::typeinfo;
          goto LAB_002c4fde;
        }
      }
      if ((this->fCalculateSrcOfs == true) && (this->fCharIndex != 0)) {
        XVar5 = this->fSrcOfsBase;
        XVar8 = 0;
        do {
          XVar5 = XVar5 + this->fCharSizeBuf[XVar8];
          this->fSrcOfsBase = XVar5;
          XVar8 = XVar8 + 1;
        } while (this->fCharIndex != XVar8);
      }
      if ((XVar4 == XVar1) || (this->fCharsAvail <= this->fCharIndex)) {
        lVar3 = 0;
      }
      else {
        lVar3 = 0;
        lVar6 = this->fCharIndex + 0x8010;
        do {
          this->fCharBuf[lVar3] = *(XMLCh *)((long)this + lVar6 * 2 + -0x10018);
          this->fCharSizeBuf[lVar3] = *(uchar *)((long)this->fCharBuf + lVar6 + -8);
          lVar3 = lVar3 + 1;
          uVar7 = lVar6 - 0x800f;
          lVar6 = lVar6 + 1;
        } while (uVar7 < this->fCharsAvail);
      }
      XVar4 = xcodeMoreChars(this,this->fCharBuf + lVar3,this->fCharSizeBuf + lVar3,0x4000 - lVar11)
      ;
      this->fCharsAvail = XVar4 + lVar11;
      this->fCharIndex = 0;
      if ((((XVar4 + lVar11 == 0) && (this->fType == Type_PE)) &&
          (this->fRefFrom == RefFrom_NonLiteral)) && (this->fSentTrailingSpace == false)) {
        this->fCharBuf[0] = L' ';
        this->fCharsAvail = 1;
        this->fSentTrailingSpace = true;
      }
      uVar7 = this->fCharsAvail;
      if (uVar7 == 0) {
        this->fNoMore = true;
      }
      if ((this->fCalculateSrcOfs == true) && (this->fCharOfsBuf[0] = 0, 1 < uVar7)) {
        lVar11 = 0;
        uVar9 = 0;
        do {
          uVar9 = uVar9 + this->fCharSizeBuf[lVar11];
          this->fCharOfsBuf[lVar11 + 1] = uVar9;
          lVar11 = lVar11 + 1;
        } while (uVar7 - 1 != lVar11);
      }
      bVar12 = uVar7 != 0;
    }
  }
  else {
    bVar12 = false;
  }
  return bVar12;
}

Assistant:

bool XMLReader::refreshCharBuffer()
{
    // If the no more flag is set, then don't bother doing anything.
    if (fNoMore)
        return false;

    XMLSize_t startInd;

    // See if we have any existing chars.
    const XMLSize_t spareChars = fCharsAvail - fCharIndex;

    // If we are full, then don't do anything.
    if (spareChars == kCharBufSize)
        return true;

    //
    //  If no transcoder has been created yet, then we never saw the
    //  any encoding="" string and the encoding was not forced, so lets
    //  create one now. We know that it won't change now.
    //
    //  However, note that if we autosensed EBCDIC, then we have to
    //  consider it an error if we never got an encoding since we don't
    //  know what variant of EBCDIC it is.
    //
    if (!fTranscoder)
    {
        if (fEncoding == XMLRecognizer::EBCDIC)
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Reader_EncodingStrRequired, fMemoryManager);

        // Ask the transcoding service to make use a transcoder
        XMLTransService::Codes failReason;
        fTranscoder = XMLPlatformUtils::fgTransService->makeNewTranscoderFor
        (
            fEncodingStr
            , failReason
            , kCharBufSize
            , fMemoryManager
        );

        if (!fTranscoder)
        {
            ThrowXMLwithMemMgr1
            (
                TranscodingException
                , XMLExcepts::Trans_CantCreateCvtrFor
                , fEncodingStr
                , fMemoryManager
            );
        }
    }

    //
    //  Add the number of source bytes eaten so far to the base src
    //  offset member.
    //
    if (fCalculateSrcOfs) {
        for (startInd = 0; startInd < fCharIndex; startInd++)
            fSrcOfsBase += fCharSizeBuf[startInd];
    }

    //
    //  If there are spare chars, then move then down to the bottom. We
    //  have to move the char sizes down also.
    //
    startInd = 0;
    if (spareChars)
    {
        for (XMLSize_t index = fCharIndex; index < fCharsAvail; index++)
        {
            fCharBuf[startInd] = fCharBuf[index];
            fCharSizeBuf[startInd] = fCharSizeBuf[index];
            startInd++;
        }
    }

    //
    //  And then get more chars, starting after any spare chars that were
    //  left over from the last time.
    //
    fCharsAvail = xcodeMoreChars
    (
        &fCharBuf[startInd]
        , &fCharSizeBuf[startInd]
        , kCharBufSize - spareChars
    );

    // Add back in the spare chars
    fCharsAvail += spareChars;

    // Reset the buffer index to zero, so we start from the 0th char again
    fCharIndex = 0;

    //
    //  If no chars available, then we have to check for one last thing. If
    //  this is reader for a PE and its not being expanded inside a literal,
    //  then unget a trailing space. We use a boolean to avoid triggering
    //  this more than once.
    //
    if (!fCharsAvail
    &&  (fType == Type_PE)
    &&  (fRefFrom == RefFrom_NonLiteral)
    &&  !fSentTrailingSpace)
    {
        fCharBuf[0] = chSpace;
        fCharsAvail = 1;
        fSentTrailingSpace = true;
    }

    //
    //  If we get here with no more chars, then set the fNoMore flag which
    //  lets us optimize and know without checking that no more chars are
    //  available.
    //
    if (!fCharsAvail)
        fNoMore = true;

    //  Calculate fCharOfsBuf using the elements from fCharBufSize
    if (fCalculateSrcOfs)
    {
        unsigned int last = 0;
        fCharOfsBuf[0] = 0;
        for (XMLSize_t index = 1; index < fCharsAvail; ++index) {
            fCharOfsBuf[index] = last+fCharSizeBuf[index-1];
            last = fCharOfsBuf[index];
            // code was:
            // fCharOfsBuf[index] = fCharOfsBuf[index-1]+fCharSizeBuf[index-1];
            // but on Solaris 64 bit with sun studio 11 this didn't work as
            // every value of fCharOfsBuf[] was 1.
        }
    }

    return (fCharsAvail != 0);
}